

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  undefined8 uVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  void *pvStack_20;
  bool enclose_local;
  string *value_local;
  char *key_local;
  xr_ini_writer *this_local;
  
  value_local = (string *)CONCAT44(in_register_00000034,__fd);
  local_21 = (byte)__n & 1;
  pvStack_20 = __buf;
  key_local = (char *)this;
  if ((__n & 1) != 0) {
    std::operator+(&local_68,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
    std::operator+(&local_48,&local_68,"\"");
    std::__cxx11::string::operator=((string *)__buf,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  psVar1 = value_local;
  uVar2 = std::__cxx11::string::c_str();
  xr_writer::w_sf((xr_writer *)this,"%9s%-34s = %s\n","",psVar1,uVar2);
  return extraout_RAX;
}

Assistant:

void xr_ini_writer::write(const char *key, std::string value, bool enclose)
{
	if (enclose)
		value = "\"" + value + "\"";
	w_sf("%9s%-34s = %s\n", "",key, value.c_str());
}